

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::to_visualize_mode(Application *this)

{
  Scene *pSVar1;
  
  if (*(int *)&(this->super_Renderer).field_0xc == 3) {
    return;
  }
  pSVar1 = this->scene;
  (pSVar1->selected).coordinates.x = 0.0;
  (pSVar1->selected).coordinates.y = 0.0;
  (pSVar1->selected).object = (SceneObject *)0x0;
  (pSVar1->selected).element = (HalfedgeElement *)0x0;
  (pSVar1->selected).coordinates.z = 0.0;
  (pSVar1->selected).axis = None;
  set_up_pathtracer(this);
  PathTracer::stop(this->pathtracer);
  PathTracer::start_visualizing(this->pathtracer);
  *(undefined4 *)&(this->super_Renderer).field_0xc = 3;
  setGhosted(this,false);
  return;
}

Assistant:

void Application::to_visualize_mode() {
  if (mode == VISUALIZE_MODE) return;
  scene->selected.clear();
  set_up_pathtracer();
  pathtracer->stop();
  pathtracer->start_visualizing();
  mode = VISUALIZE_MODE;
  setGhosted(false);
}